

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaFreeIDCStateObjList(xmlSchemaIDCStateObjPtr_conflict sto)

{
  xmlSchemaIDCStateObjPtr pxVar1;
  xmlSchemaIDCStateObjPtr_conflict next;
  xmlSchemaIDCStateObjPtr_conflict sto_local;
  
  next = sto;
  while (next != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    pxVar1 = next->next;
    if (next->history != (int *)0x0) {
      (*xmlFree)(next->history);
    }
    if (next->xpathCtxt != (void *)0x0) {
      xmlFreeStreamCtxt((xmlStreamCtxtPtr)next->xpathCtxt);
    }
    (*xmlFree)(next);
    next = pxVar1;
  }
  return;
}

Assistant:

static void
xmlSchemaFreeIDCStateObjList(xmlSchemaIDCStateObjPtr sto)
{
    xmlSchemaIDCStateObjPtr next;
    while (sto != NULL) {
	next = sto->next;
	if (sto->history != NULL)
	    xmlFree(sto->history);
	if (sto->xpathCtxt != NULL)
	    xmlFreeStreamCtxt((xmlStreamCtxtPtr) sto->xpathCtxt);
	xmlFree(sto);
	sto = next;
    }
}